

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O3

void ** __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
          (RepeatedPtrFieldBase *this,int extend_amount)

{
  uint uVar1;
  uint *__dest;
  void *pvVar2;
  Rep *__src;
  LogMessage *this_00;
  RepeatedPtrFieldBase *unaff_RBX;
  int iVar3;
  long unaff_RBP;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  Arena *unaff_R14;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  string_view str;
  int local_44;
  LogMessage local_40;
  
  if (extend_amount < 1) {
    InternalExtend((RepeatedPtrFieldBase *)&local_40);
    this = unaff_RBX;
  }
  else {
    iVar5 = this->capacity_proxy_;
    unaff_RBP = (long)iVar5 + 1;
    unaff_R14 = this->arena_;
    iVar3 = (int)unaff_RBP;
    uVar4 = extend_amount + iVar3;
    if (uVar4 == 0 || SCARRY4(extend_amount,iVar3) != (int)uVar4 < 0) {
      uVar6 = 1;
      goto LAB_00fabbb3;
    }
    if (iVar5 < 0x3ffffffb) {
      if (iVar5 < -1) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                   ,0x493,"capacity == 0 || capacity >= lower_limit");
        local_44 = iVar3;
        this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                            (&local_40,&local_44);
        str._M_str = " ";
        str._M_len = 1;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (this_00,str);
        local_44 = 1;
        absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(this_00,&local_44);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_40);
      }
      uVar1 = iVar3 * 2 + 1;
      if (uVar4 < uVar1) {
        uVar4 = uVar1;
      }
      uVar6 = (ulong)uVar4;
      goto LAB_00fabbb3;
    }
  }
  uVar6 = 0x7fffffff;
LAB_00fabbb3:
  iVar5 = (int)uVar6;
  if (unaff_R14 == (Arena *)0x0) {
    uVar6 = uVar6 * 8 + 8;
    if (*(code **)(in_FS_OFFSET + -0x48) == (code *)0x0) {
      pvVar2 = operator_new(uVar6);
      auVar7._8_8_ = uVar6;
      auVar7._0_8_ = pvVar2;
    }
    else {
      auVar7 = (**(code **)(in_FS_OFFSET + -0x48))(uVar6,*(undefined8 *)(in_FS_OFFSET + -0x40));
    }
    __dest = auVar7._0_8_;
    iVar5 = (int)(auVar7._8_8_ + 0x7fffffff8U >> 3);
  }
  else {
    __dest = (uint *)Arena::AllocateForArray(unaff_R14,uVar6 * 8 + 0xf & 0x7fffffff8);
  }
  this->capacity_proxy_ = iVar5 + -1;
  pvVar2 = this->tagged_rep_or_elem_;
  if (((ulong)pvVar2 & 1) == 0) {
    *__dest = (uint)(pvVar2 != (void *)0x0);
    *(void **)(__dest + 2) = pvVar2;
  }
  else {
    __src = rep(this);
    memcpy(__dest,__src,(long)__src->allocated_size * 8 + 8);
    uVar6 = unaff_RBP * 8 + 8;
    if (unaff_R14 == (Arena *)0x0) {
      operator_delete(__src,uVar6);
    }
    else if (*(uint64_t *)(in_FS_OFFSET + -0x78) == (unaff_R14->impl_).tag_and_id_) {
      SerialArena::ReturnArrayMemory(*(SerialArena **)(in_FS_OFFSET + -0x70),__src,uVar6);
    }
  }
  this->tagged_rep_or_elem_ = (void *)((long)__dest + 1);
  return (void **)(__dest + (long)this->current_size_ * 2 + 2);
}

Assistant:

void** RepeatedPtrFieldBase::InternalExtend(int extend_amount) {
  ABSL_DCHECK(extend_amount > 0);
  constexpr size_t kPtrSize = sizeof(rep()->elements[0]);
  constexpr size_t kMaxSize = std::numeric_limits<size_t>::max();
  constexpr size_t kMaxCapacity = (kMaxSize - kRepHeaderSize) / kPtrSize;
  const int old_capacity = Capacity();
  Arena* arena = GetArena();
  Rep* new_rep = nullptr;
  {
    int new_capacity = internal::CalculateReserveSize<void*, kRepHeaderSize>(
        old_capacity, old_capacity + extend_amount);
    ABSL_DCHECK_LE(new_capacity, kMaxCapacity)
        << "New capacity is too large to fit into internal representation";
    const size_t new_size = kRepHeaderSize + kPtrSize * new_capacity;
    if (arena == nullptr) {
      const internal::SizedPtr alloc = internal::AllocateAtLeast(new_size);
      new_capacity = static_cast<int>((alloc.n - kRepHeaderSize) / kPtrSize);
      new_rep = reinterpret_cast<Rep*>(alloc.p);
    } else {
      auto* alloc = Arena::CreateArray<char>(arena, new_size);
      new_rep = reinterpret_cast<Rep*>(alloc);
    }
    capacity_proxy_ = new_capacity - kSSOCapacity;
  }

  if (using_sso()) {
    new_rep->allocated_size = tagged_rep_or_elem_ != nullptr ? 1 : 0;
    new_rep->elements[0] = tagged_rep_or_elem_;
  } else {
    Rep* old_rep = rep();
    memcpy(new_rep, old_rep,
           old_rep->allocated_size * kPtrSize + kRepHeaderSize);
    size_t old_size = old_capacity * kPtrSize + kRepHeaderSize;
    if (arena == nullptr) {
      internal::SizedDelete(old_rep, old_size);
    } else {
      arena->ReturnArrayMemory(old_rep, old_size);
    }
  }

  tagged_rep_or_elem_ =
      reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(new_rep) + 1);

  return &new_rep->elements[current_size_];
}